

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_enumerate(char *_fn,PHYSFS_EnumerateCallback cb,void *data)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined1 *ptr;
  undefined8 uVar3;
  int iVar4;
  PHYSFS_ErrorCode PVar5;
  PHYSFS_ErrorCode PVar6;
  size_t sVar7;
  ulong len_00;
  void *ptr_00;
  char *dst;
  undefined1 *puVar8;
  undefined1 auStack_b8 [7];
  bool local_b1;
  undefined1 *local_b0;
  undefined1 local_a8 [8];
  PHYSFS_Stat statbuf;
  char *arcfname;
  SymlinkFilterData filterdata;
  DirHandle *i;
  char *fname;
  char *allocated_fname;
  size_t len;
  PHYSFS_EnumerateCallbackResult retval;
  void *data_local;
  PHYSFS_EnumerateCallback cb_local;
  char *_fn_local;
  
  puVar8 = auStack_b8;
  len._4_4_ = PHYSFS_ENUM_OK;
  if (_fn == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    _fn_local._4_4_ = 0;
  }
  else if (cb == (PHYSFS_EnumerateCallback)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    _fn_local._4_4_ = 0;
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    sVar7 = strlen(_fn);
    len_00 = sVar7 + longest_root + 1;
    if (len_00 < 0x100) {
      puVar8 = auStack_b8 + -(sVar7 + longest_root + 0x18 & 0xfffffffffffffff0);
      local_b0 = puVar8;
    }
    else {
      local_b0 = (undefined1 *)0x0;
    }
    ptr = local_b0;
    *(undefined8 *)(puVar8 + -8) = 0x109475;
    ptr_00 = __PHYSFS_initSmallAlloc(ptr,len_00);
    if (ptr_00 == (void *)0x0) {
      *(undefined8 *)(puVar8 + -8) = 0x10948a;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      *(undefined8 *)(puVar8 + -8) = 0x109496;
      __PHYSFS_platformReleaseMutex(stateLock);
      _fn_local._4_4_ = 0;
    }
    else {
      dst = (char *)((long)ptr_00 + longest_root);
      *(undefined8 *)(puVar8 + -8) = 0x1094c0;
      iVar4 = sanitizePlatformIndependentPath(_fn,dst);
      if (iVar4 == 0) {
        len._4_4_ = PHYSFS_ENUM_STOP;
      }
      else {
        if (allowSymLinks == 0) {
          *(undefined8 *)(puVar8 + -8) = 0x1094ea;
          memset(&arcfname,0,0x28);
          arcfname = (char *)cb;
          filterdata.callback = (PHYSFS_EnumerateCallback)data;
        }
        for (filterdata._32_8_ = searchPath; uVar3 = filterdata._32_8_,
            local_b1 = len._4_4_ == PHYSFS_ENUM_OK && filterdata._32_8_ != 0,
            len._4_4_ == PHYSFS_ENUM_OK && filterdata._32_8_ != 0;
            filterdata._32_8_ = *(undefined8 *)(filterdata._32_8_ + 0x30)) {
          statbuf._32_8_ = dst;
          *(undefined8 *)(puVar8 + -8) = 0x109545;
          iVar4 = partOfMountPoint((DirHandle *)uVar3,dst);
          uVar2 = filterdata._32_8_;
          uVar3 = statbuf._32_8_;
          if (iVar4 == 0) {
            *(undefined8 *)(puVar8 + -8) = 0x10957a;
            iVar4 = verifyPath((DirHandle *)uVar2,(char **)&statbuf.filetype,0);
            uVar3 = statbuf._32_8_;
            if (iVar4 != 0) {
              pcVar1 = *(code **)(*(long *)(filterdata._32_8_ + 0x28) + 0x68);
              uVar2 = *(undefined8 *)filterdata._32_8_;
              *(undefined8 *)(puVar8 + -8) = 0x1095a3;
              iVar4 = (*pcVar1)(uVar2,uVar3,local_a8);
              if (iVar4 == 0) {
                *(undefined8 *)(puVar8 + -8) = 0x1095ad;
                PVar5 = currentErrorCode();
                if (PVar5 == PHYSFS_ERR_NOT_FOUND) goto LAB_00109669;
              }
              uVar3 = statbuf._32_8_;
              if ((int)statbuf.accesstime == 1) {
                if ((allowSymLinks == 0) &&
                   (*(int *)(*(long *)(filterdata._32_8_ + 0x28) + 0x28) != 0)) {
                  filterdata.callbackData = (void *)filterdata._32_8_;
                  filterdata.dirhandle = (DirHandle *)statbuf._32_8_;
                  filterdata.arcfname._0_4_ = PHYSFS_ERR_OK;
                  pcVar1 = *(code **)(*(long *)(filterdata._32_8_ + 0x28) + 0x38);
                  uVar2 = *(undefined8 *)filterdata._32_8_;
                  *(undefined8 *)(puVar8 + -8) = 0x10961a;
                  len._4_4_ = (*pcVar1)(uVar2,uVar3,enumCallbackFilterSymLinks,_fn,&arcfname);
                  if (len._4_4_ == PHYSFS_ENUM_ERROR) {
                    *(undefined8 *)(puVar8 + -8) = 0x109628;
                    PVar6 = currentErrorCode();
                    PVar5 = (PHYSFS_ErrorCode)filterdata.arcfname;
                    if (PVar6 == PHYSFS_ERR_APP_CALLBACK) {
                      *(undefined8 *)(puVar8 + -8) = 0x109635;
                      PHYSFS_setErrorCode(PVar5);
                    }
                  }
                }
                else {
                  pcVar1 = *(code **)(*(long *)(filterdata._32_8_ + 0x28) + 0x38);
                  uVar2 = *(undefined8 *)filterdata._32_8_;
                  *(undefined8 *)(puVar8 + -8) = 0x10965e;
                  len._4_4_ = (*pcVar1)(uVar2,uVar3,cb,_fn,data);
                }
              }
            }
          }
          else {
            *(undefined8 *)(puVar8 + -8) = 0x109563;
            len._4_4_ = enumerateFromMountPoint((DirHandle *)uVar2,(char *)uVar3,cb,_fn,data);
          }
LAB_00109669:
        }
      }
      *(undefined8 *)(puVar8 + -8) = 0x109688;
      __PHYSFS_platformReleaseMutex(stateLock);
      *(undefined8 *)(puVar8 + -8) = 0x109691;
      __PHYSFS_smallFree(ptr_00);
      _fn_local._4_4_ = (uint)(len._4_4_ != PHYSFS_ENUM_ERROR);
    }
  }
  return _fn_local._4_4_;
}

Assistant:

int PHYSFS_enumerate(const char *_fn, PHYSFS_EnumerateCallback cb, void *data)
{
    PHYSFS_EnumerateCallbackResult retval = PHYSFS_ENUM_OK;
    size_t len;
    char *allocated_fname;
    char *fname;

    BAIL_IF(!_fn, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!cb, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    len = strlen(_fn) + longest_root + 1;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root;
    if (!sanitizePlatformIndependentPath(_fn, fname))
        retval = PHYSFS_ENUM_STOP;
    else
    {
        DirHandle *i;
        SymlinkFilterData filterdata;

        if (!allowSymLinks)
        {
            memset(&filterdata, '\0', sizeof (filterdata));
            filterdata.callback = cb;
            filterdata.callbackData = data;
        } /* if */

        for (i = searchPath; (retval == PHYSFS_ENUM_OK) && i; i = i->next)
        {
            char *arcfname = fname;

            if (partOfMountPoint(i, arcfname))
                retval = enumerateFromMountPoint(i, arcfname, cb, _fn, data);

            else if (verifyPath(i, &arcfname, 0))
            {
                PHYSFS_Stat statbuf;
                if (!i->funcs->stat(i->opaque, arcfname, &statbuf))
                {
                    if (currentErrorCode() == PHYSFS_ERR_NOT_FOUND)
                        continue;  /* no such dir in this archive, skip it. */
                } /* if */

                if (statbuf.filetype != PHYSFS_FILETYPE_DIRECTORY)
                    continue;  /* not a directory in this archive, skip it. */

                else if ((!allowSymLinks) && (i->funcs->info.supportsSymlinks))
                {
                    filterdata.dirhandle = i;
                    filterdata.arcfname = arcfname;
                    filterdata.errcode = PHYSFS_ERR_OK;
                    retval = i->funcs->enumerate(i->opaque, arcfname,
                                                 enumCallbackFilterSymLinks,
                                                 _fn, &filterdata);
                    if (retval == PHYSFS_ENUM_ERROR)
                    {
                        if (currentErrorCode() == PHYSFS_ERR_APP_CALLBACK)
                            PHYSFS_setErrorCode(filterdata.errcode);
                    } /* if */
                } /* else if */
                else
                {
                    retval = i->funcs->enumerate(i->opaque, arcfname,
                                                 cb, _fn, data);
                } /* else */
            } /* else if */
        } /* for */

    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);

    __PHYSFS_smallFree(allocated_fname);

    return (retval == PHYSFS_ENUM_ERROR) ? 0 : 1;
}